

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

bool __thiscall cmdline::parser::parse(parser *this,int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  size_type sVar7;
  mapped_type *ppoVar8;
  size_type sVar9;
  mapped_type *pmVar10;
  pointer ppVar11;
  size_type sVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  _Self local_388;
  _Self local_380;
  iterator p_2;
  value_type local_370;
  allocator local_349;
  string local_348;
  allocator local_321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  allocator local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  allocator local_291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  allocator local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  int local_208;
  char local_202;
  allocator local_201;
  int j;
  char last;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  allocator local_199;
  undefined1 local_198 [8];
  string name_1;
  undefined1 local_170 [8];
  string val;
  undefined1 local_148 [8];
  string name;
  char *p_1;
  int i;
  allocator local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  char local_a1;
  iterator iStack_a0;
  char initial;
  _Self local_98;
  iterator p;
  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  lookup;
  allocator local_49;
  value_type local_48;
  char **local_28;
  char **argv_local;
  parser *ppStack_18;
  int argc_local;
  parser *this_local;
  
  local_28 = argv;
  argv_local._4_4_ = argc;
  ppStack_18 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->errors);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->others);
  if (argv_local._4_4_ < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"argument number must be longer than 0",&local_49);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->errors,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
  }
  else {
    bVar2 = std::operator==(&this->prog_name,"");
    if (bVar2) {
      std::__cxx11::string::operator=((string *)&this->prog_name,*local_28);
    }
    std::
    map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&p);
    local_98._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
         ::begin(&this->options);
    while( true ) {
      iStack_a0 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                  ::end(&this->options);
      bVar2 = std::operator!=(&local_98,&stack0xffffffffffffff60);
      if (!bVar2) break;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
      ::operator->(&local_98);
      lVar5 = std::__cxx11::string::length();
      if (lVar5 != 0) {
        ppVar11 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                  ::operator->(&local_98);
        iVar3 = (*ppVar11->second->_vptr_option_base[9])();
        local_a1 = (char)iVar3;
        if (local_a1 != '\0') {
          sVar9 = std::
                  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::count((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&p,&local_a1);
          if (sVar9 != 0) {
            pmVar10 = std::
                      map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&p,&local_a1);
            std::__cxx11::string::operator=((string *)pmVar10,"");
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_108,"short option \'",&local_109);
            std::operator+(&local_e8,&local_108,local_a1);
            std::operator+(&local_c8,&local_e8,"\' is ambiguous");
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->errors,&local_c8);
            std::__cxx11::string::~string((string *)&local_c8);
            std::__cxx11::string::~string((string *)&local_e8);
            std::__cxx11::string::~string((string *)&local_108);
            std::allocator<char>::~allocator((allocator<char> *)&local_109);
            this_local._7_1_ = false;
            goto LAB_00195394;
          }
          ppVar11 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                    ::operator->(&local_98);
          pmVar10 = std::
                    map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&p,&local_a1);
          std::__cxx11::string::operator=((string *)pmVar10,(string *)ppVar11);
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
      ::operator++(&local_98,0);
    }
    for (p_1._4_4_ = 1; p_1._4_4_ < argv_local._4_4_; p_1._4_4_ = p_1._4_4_ + 1) {
      iVar3 = strncmp(local_28[p_1._4_4_],"--",2);
      if (iVar3 == 0) {
        pcVar6 = strchr(local_28[p_1._4_4_] + 2,0x3d);
        name.field_2._8_8_ = pcVar6;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = local_28[p_1._4_4_];
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_198,pcVar6 + 2,&local_199);
          std::allocator<char>::~allocator((allocator<char> *)&local_199);
          sVar7 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                  ::count(&this->options,(key_type *)local_198);
          if (sVar7 == 0) {
            std::operator+(&local_1c0,"undefined option: --",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_198);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->errors,&local_1c0);
            std::__cxx11::string::~string((string *)&local_1c0);
          }
          else {
            ppoVar8 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                      ::operator[](&this->options,(key_type *)local_198);
            uVar4 = (*(*ppoVar8)->_vptr_option_base[2])();
            if ((uVar4 & 1) == 0) {
              set_option(this,(string *)local_198);
            }
            else if (p_1._4_4_ + 1 < argv_local._4_4_) {
              p_1._4_4_ = p_1._4_4_ + 1;
              pcVar6 = local_28[p_1._4_4_];
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&j,pcVar6,&local_201);
              set_option(this,(string *)local_198,(string *)&j);
              std::__cxx11::string::~string((string *)&j);
              std::allocator<char>::~allocator((allocator<char> *)&local_201);
            }
            else {
              std::operator+(&local_1e0,"option needs value: --",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_198);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&this->errors,&local_1e0);
              std::__cxx11::string::~string((string *)&local_1e0);
            }
          }
          std::__cxx11::string::~string((string *)local_198);
        }
        else {
          pcVar1 = local_28[p_1._4_4_];
          std::allocator<char>::allocator();
          std::__cxx11::string::string<char_const*,void>
                    ((string *)local_148,pcVar1 + 2,pcVar6,
                     (allocator<char> *)(val.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator((allocator<char> *)(val.field_2._M_local_buf + 0xf));
          pcVar6 = (char *)(name.field_2._8_8_ + 1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_170,pcVar6,(allocator *)(name_1.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator((allocator<char> *)(name_1.field_2._M_local_buf + 0xf));
          set_option(this,(string *)local_148,(string *)local_170);
          std::__cxx11::string::~string((string *)local_170);
          std::__cxx11::string::~string((string *)local_148);
        }
      }
      else {
        iVar3 = strncmp(local_28[p_1._4_4_],"-",1);
        if (iVar3 == 0) {
          if (local_28[p_1._4_4_][1] != '\0') {
            local_202 = local_28[p_1._4_4_][1];
            for (local_208 = 2; local_28[p_1._4_4_][local_208] != '\0'; local_208 = local_208 + 1) {
              local_202 = local_28[p_1._4_4_][local_208];
              sVar9 = std::
                      map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::count((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&p,local_28[p_1._4_4_] + (local_208 + -1));
              if (sVar9 == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_248,"undefined short option: -",&local_249);
                std::operator+(&local_228,&local_248,local_28[p_1._4_4_][local_208 + -1]);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&this->errors,&local_228);
                std::__cxx11::string::~string((string *)&local_228);
                std::__cxx11::string::~string((string *)&local_248);
                std::allocator<char>::~allocator((allocator<char> *)&local_249);
              }
              else {
                pmVar10 = std::
                          map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&p,local_28[p_1._4_4_] + (local_208 + -1));
                bVar2 = std::operator==(pmVar10,"");
                if (bVar2) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_290,"ambiguous short option: -",&local_291);
                  std::operator+(&local_270,&local_290,local_28[p_1._4_4_][local_208 + -1]);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&this->errors,&local_270);
                  std::__cxx11::string::~string((string *)&local_270);
                  std::__cxx11::string::~string((string *)&local_290);
                  std::allocator<char>::~allocator((allocator<char> *)&local_291);
                }
                else {
                  pmVar10 = std::
                            map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)&p,local_28[p_1._4_4_] + (local_208 + -1));
                  set_option(this,pmVar10);
                }
              }
            }
            sVar9 = std::
                    map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::count((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&p,&local_202);
            if (sVar9 == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_2d8,"undefined short option: -",&local_2d9);
              std::operator+(&local_2b8,&local_2d8,local_202);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&this->errors,&local_2b8);
              std::__cxx11::string::~string((string *)&local_2b8);
              std::__cxx11::string::~string((string *)&local_2d8);
              std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
            }
            else {
              pmVar10 = std::
                        map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&p,&local_202);
              bVar2 = std::operator==(pmVar10,"");
              if (bVar2) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_320,"ambiguous short option: -",&local_321);
                std::operator+(&local_300,&local_320,local_202);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&this->errors,&local_300);
                std::__cxx11::string::~string((string *)&local_300);
                std::__cxx11::string::~string((string *)&local_320);
                std::allocator<char>::~allocator((allocator<char> *)&local_321);
              }
              else {
                if (p_1._4_4_ + 1 < argv_local._4_4_) {
                  pmVar10 = std::
                            map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)&p,&local_202);
                  ppoVar8 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                            ::operator[](&this->options,pmVar10);
                  uVar4 = (*(*ppoVar8)->_vptr_option_base[2])();
                  if ((uVar4 & 1) != 0) {
                    pmVar10 = std::
                              map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)&p,&local_202);
                    pcVar6 = local_28[(long)p_1._4_4_ + 1];
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_348,pcVar6,&local_349);
                    set_option(this,pmVar10,&local_348);
                    std::__cxx11::string::~string((string *)&local_348);
                    std::allocator<char>::~allocator((allocator<char> *)&local_349);
                    p_1._4_4_ = p_1._4_4_ + 1;
                    goto LAB_00195218;
                  }
                }
                pmVar10 = std::
                          map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&p,&local_202);
                set_option(this,pmVar10);
              }
            }
          }
        }
        else {
          pcVar6 = local_28[p_1._4_4_];
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_370,pcVar6,(allocator *)((long)&p_2._M_node + 7));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->others,&local_370);
          std::__cxx11::string::~string((string *)&local_370);
          std::allocator<char>::~allocator((allocator<char> *)((long)&p_2._M_node + 7));
        }
      }
LAB_00195218:
    }
    local_380._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
         ::begin(&this->options);
    while( true ) {
      local_388._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
           ::end(&this->options);
      bVar2 = std::operator!=(&local_380,&local_388);
      if (!bVar2) break;
      ppVar11 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                ::operator->(&local_380);
      uVar4 = (*ppVar11->second->_vptr_option_base[6])();
      if ((uVar4 & 1) == 0) {
        ppVar11 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                  ::operator->(&local_380);
        std::__cxx11::string::string((string *)&local_3c8,(string *)ppVar11);
        std::operator+(&local_3a8,"need option: --",&local_3c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->errors,&local_3a8);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_3c8);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
      ::operator++(&local_380,0);
    }
    sVar12 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&this->errors);
    this_local._7_1_ = sVar12 == 0;
LAB_00195394:
    std::
    map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&p);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool parse(int argc, const char *const argv[])
		{
			errors.clear();
			others.clear();

			if(argc < 1)
			{
				errors.push_back("argument number must be longer than 0");
				return false;
			}

			if(prog_name == "")
				prog_name = argv[0];

			std::map<char, std::string> lookup;
			for(std::map<std::string, option_base *>::iterator p = options.begin(); p != options.end(); p++)
			{
				if(p->first.length() == 0)
					continue;

				char initial = p->second->short_name();
				if(initial)
				{
					if(lookup.count(initial) > 0)
					{
						lookup[initial] = "";
						errors.push_back(std::string("short option '") + initial + "' is ambiguous");
						return false;
					}
					else
						lookup[initial] = p->first;
				}
			}

			for(int i = 1; i < argc; i++)
			{
				if(strncmp(argv[i], "--", 2) == 0)
				{
					const char *p = strchr(argv[i] + 2, '=');
					if(p)
					{
						std::string name(argv[i] + 2, p);
						std::string val(p + 1);
						set_option(name, val);
					}
					else
					{
						std::string name(argv[i] + 2);
						if(options.count(name) == 0)
						{
							errors.push_back("undefined option: --" + name);
							continue;
						}
						if(options[name]->has_value())
						{
							if(i + 1 >= argc)
							{
								errors.push_back("option needs value: --" + name);
								continue;
							}
							else
							{
								i++;
								set_option(name, argv[i]);
							}
						}
						else
						{
							set_option(name);
						}
					}
				}
				else if(strncmp(argv[i], "-", 1) == 0)
				{
					if(!argv[i][1])
						continue;

					char last = argv[i][1];
					for(int j = 2; argv[i][j]; j++)
					{
						last = argv[i][j];
						if(lookup.count(argv[i][j - 1]) == 0)
						{
							errors.push_back(std::string("undefined short option: -") + argv[i][j - 1]);
							continue;
						}

						if(lookup[argv[i][j - 1]] == "")
						{
							errors.push_back(std::string("ambiguous short option: -") + argv[i][j - 1]);
							continue;
						}

						set_option(lookup[argv[i][j - 1]]);
					}

					if(lookup.count(last) == 0)
					{
						errors.push_back(std::string("undefined short option: -") + last);
						continue;
					}

					if(lookup[last] == "")
					{
						errors.push_back(std::string("ambiguous short option: -") + last);
						continue;
					}

					if(i + 1 < argc && options[lookup[last]]->has_value())
					{
						set_option(lookup[last], argv[i + 1]);
						i++;
					}
					else
					{
						set_option(lookup[last]);
					}
				}
				else
				{
					others.push_back(argv[i]);
				}
			}

			for(std::map<std::string, option_base *>::iterator p = options.begin(); p != options.end(); p++)
			{
				if(!p->second->valid())
				{
					errors.push_back("need option: --" + std::string(p->first));
				}
			}

			return errors.size() == 0;
		}